

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer_manager.cpp
# Opt level: O1

void __thiscall
duckdb::CSVBufferManager::CSVBufferManager
          (CSVBufferManager *this,ClientContext *context_p,CSVReaderOptions *options,
          OpenFileInfo *file_p,bool per_file_single_threaded_p,
          unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>
          *file_handle_p)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_duckdb::CSVFileHandle_*,_false> _Var3;
  _Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_> __ptr_00;
  _Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_> _Var4;
  pointer __p;
  pointer pCVar5;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CSVFileHandle_*,_false> __ptr_01;
  CSVBufferManager *this_00;
  _Head_base<0UL,_duckdb::CSVFileHandle_*,_false> local_30;
  
  (this->file_handle).
  super_unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>._M_t.
  super___uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
  super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false> =
       (_Head_base<0UL,_duckdb::CSVFileHandle_*,_false>)0x0;
  this->context = context_p;
  this->skip_rows = 0;
  this->sniffing = false;
  this->per_file_single_threaded = per_file_single_threaded_p;
  (this->file).path._M_dataplus._M_p = (pointer)&(this->file).path.field_2;
  pcVar1 = (file_p->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file,pcVar1,pcVar1 + (file_p->path)._M_string_length);
  (this->file).extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (file_p->extended_info).internal.
       super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (file_p->extended_info).internal.
           super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->file).extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->last_buffer).internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->global_csv_pos = 0;
  (this->cached_buffers).
  super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->last_buffer).internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->cached_buffers).
  super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cached_buffers).
  super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->buffer_size = (options->buffer_size_option).value;
  this->done = false;
  this->bytes_read = 0;
  (this->main_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->main_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->main_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->main_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->main_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->has_seeked = false;
  (this->reset_when_possible)._M_h._M_buckets = &(this->reset_when_possible)._M_h._M_single_bucket;
  (this->reset_when_possible)._M_h._M_bucket_count = 1;
  (this->reset_when_possible)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reset_when_possible)._M_h._M_element_count = 0;
  (this->reset_when_possible)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reset_when_possible)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reset_when_possible)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  _Var3._M_head_impl =
       (file_handle_p->
       super_unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>)._M_t.
       super___uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
       super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl;
  if (_Var3._M_head_impl == (CSVFileHandle *)0x0) {
    ReadCSV::OpenCSV((ReadCSV *)&stack0xffffffffffffffd0,&this->file,options,this->context);
    _Var4.super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::CSVFileHandle_*,_false>)
         (_Head_base<0UL,_duckdb::CSVFileHandle_*,_false>)local_30._M_head_impl;
    local_30._M_head_impl = (CSVFileHandle *)0x0;
    __ptr_00.super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl =
         (this->file_handle).
         super_unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>._M_t.
         super___uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>
         .super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>;
    (this->file_handle).
    super_unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>._M_t.
    super___uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
    super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false> =
         _Var4.super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl;
    if (__ptr_00.super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl !=
        (CSVFileHandle *)0x0) {
      ::std::default_delete<duckdb::CSVFileHandle>::operator()
                ((default_delete<duckdb::CSVFileHandle> *)this,
                 (CSVFileHandle *)
                 __ptr_00.super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl);
    }
    if ((__uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>)
        local_30._M_head_impl ==
        (__uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>)0x0)
    goto LAB_0167dfd5;
    __ptr_01._M_head_impl = local_30._M_head_impl;
    this_00 = (CSVBufferManager *)&stack0xffffffffffffffd0;
  }
  else {
    (file_handle_p->
    super_unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
    super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl = (CSVFileHandle *)0x0;
    __ptr_01._M_head_impl =
         (this->file_handle).
         super_unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>._M_t.
         super___uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>
         .super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl;
    (this->file_handle).
    super_unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>._M_t.
    super___uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
    super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false> =
         (_Head_base<0UL,_duckdb::CSVFileHandle_*,_false>)_Var3._M_head_impl;
    this_00 = this;
    if (__ptr_01._M_head_impl == (CSVFileHandle *)0x0) goto LAB_0167dfd5;
  }
  ::std::default_delete<duckdb::CSVFileHandle>::operator()
            ((default_delete<duckdb::CSVFileHandle> *)this_00,__ptr_01._M_head_impl);
LAB_0167dfd5:
  pCVar5 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
           operator->(&this->file_handle);
  this->is_pipe = pCVar5->is_pipe;
  this->skip_rows = (options->dialect_options).skip_rows.value;
  Initialize(this);
  return;
}

Assistant:

CSVBufferManager::CSVBufferManager(ClientContext &context_p, const CSVReaderOptions &options,
                                   const OpenFileInfo &file_p, bool per_file_single_threaded_p,
                                   unique_ptr<CSVFileHandle> file_handle_p)
    : context(context_p), per_file_single_threaded(per_file_single_threaded_p), file(file_p),
      buffer_size(options.buffer_size_option.GetValue()) {
	D_ASSERT(!file.path.empty());
	if (file_handle_p) {
		file_handle = std::move(file_handle_p);
	} else {
		file_handle = ReadCSV::OpenCSV(file, options, context);
	}
	is_pipe = file_handle->IsPipe();
	skip_rows = options.dialect_options.skip_rows.GetValue();
	Initialize();
}